

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostEmscripten.cpp
# Opt level: O1

void __thiscall wasm::PostEmscripten::optimizeExceptions(PostEmscripten *this,Module *module)

{
  size_t *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  Function *pFVar3;
  char *pcVar4;
  pointer puVar5;
  Module *wasm;
  bool bVar6;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *imp;
  pointer puVar7;
  bool bVar8;
  bool bVar9;
  WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_> local_238;
  CallGraphPropertyAnalysis<Info> *local_130;
  size_t *local_128;
  undefined1 local_120 [8];
  CallGraphPropertyAnalysis<Info> analyzer;
  FlatTable flatTable;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  Module *local_40;
  PostEmscripten *local_38;
  
  puVar7 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar2) {
    bVar8 = false;
    bVar9 = false;
    local_40 = module;
    local_38 = this;
    do {
      pFVar3 = (puVar7->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pcVar4 = *(char **)((long)&(pFVar3->super_Importable).module + 8);
      if (((pcVar4 != (char *)0x0) && (pcVar4 == DAT_00dbd8a0)) &&
         (bVar6 = IString::startsWith<8>
                            (&(pFVar3->super_Importable).base.super_IString,(char (*) [8])"invoke_")
         , bVar9 = bVar8, bVar6)) {
        bVar8 = true;
        bVar9 = true;
      }
      wasm = local_40;
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
    if ((bVar9) &&
       (puVar5 = (local_40->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       puVar5 != (local_40->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
      this_00 = &analyzer.map._M_t._M_impl.super__Rb_tree_header._M_node_count;
      TableUtils::FlatTable::FlatTable
                ((FlatTable *)this_00,local_40,
                 (puVar5->_M_t).
                 super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                 super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl);
      if ((char)flatTable.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == '\x01') {
        flatTable.valid = false;
        flatTable._25_7_ = 0;
        wasm::ModuleUtils::CallGraphPropertyAnalysis<Info>::CallGraphPropertyAnalysis
                  ((CallGraphPropertyAnalysis<Info> *)local_120,wasm,(Func *)&flatTable.valid);
        std::
        _Function_handler<void_(wasm::Function_*,_Info_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/PostEmscripten.cpp:276:16)>
        ::_M_manager((_Any_data *)&flatTable.valid,(_Any_data *)&flatTable.valid,__destroy_functor);
        local_a8._M_unused._M_object = (void *)0x0;
        local_a8._8_8_ = 0;
        local_90 = std::
                   _Function_handler<bool_(const_Info_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/PostEmscripten.cpp:286:7)>
                   ::_M_invoke;
        local_98 = std::
                   _Function_handler<bool_(const_Info_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/PostEmscripten.cpp:286:7)>
                   ::_M_manager;
        local_88._M_unused._M_object = (void *)0x0;
        local_88._8_8_ = 0;
        local_70 = std::
                   _Function_handler<bool_(const_Info_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/PostEmscripten.cpp:287:7)>
                   ::_M_invoke;
        local_78 = std::
                   _Function_handler<bool_(const_Info_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/PostEmscripten.cpp:287:7)>
                   ::_M_manager;
        local_68._M_unused._M_object = (void *)0x0;
        local_68._8_8_ = 0;
        local_50 = std::
                   _Function_handler<void_(Info_&,_wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/PostEmscripten.cpp:288:7)>
                   ::_M_invoke;
        local_58 = std::
                   _Function_handler<void_(Info_&,_wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/PostEmscripten.cpp:288:7)>
                   ::_M_manager;
        wasm::ModuleUtils::CallGraphPropertyAnalysis<Info>::propagateBack
                  ((CallGraphPropertyAnalysis<Info> *)local_120,
                   (function<bool_(const_Info_&)> *)&local_a8,
                   (function<bool_(const_Info_&)> *)&local_88,
                   (function<void_(Info_&,_wasm::Function_*)> *)&local_68,NonDirectCallsHaveProperty
                  );
        if (local_58 != (code *)0x0) {
          (*local_58)(&local_68,&local_68,__destroy_functor);
        }
        if (local_78 != (code *)0x0) {
          (*local_78)(&local_88,&local_88,__destroy_functor);
        }
        if (local_98 != (code *)0x0) {
          (*local_98)(&local_a8,&local_a8,__destroy_functor);
        }
        paVar1 = &local_238.super_Pass.name.field_2;
        local_238.super_Pass.runner = (PassRunner *)0x0;
        local_238.super_Pass.name._M_string_length = 0;
        local_238.super_Pass.name.field_2._M_local_buf[0] = '\0';
        local_238.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
        super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.replacep =
             (Expression **)0x0;
        local_238.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
        super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.stack.usedFixed = 0;
        local_238.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
        super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task,_std::allocator<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_238.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
        super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task,_std::allocator<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_238.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
        super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task,_std::allocator<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_238.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
        super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.currFunction =
             (Function *)0x0;
        local_238.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
        super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.currModule =
             (Module *)0x0;
        local_238.super_Pass._vptr_Pass = (_func_int **)&PTR__WalkerPass_00d89e98;
        local_238.super_Pass.name._M_dataplus._M_p = (pointer)paVar1;
        local_130 = &analyzer;
        local_128 = this_00;
        WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>::run
                  (&local_238,(local_38->super_Pass).runner,wasm);
        if (local_238.super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
            super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task,_std::allocator<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_238.
                          super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                          super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.stack
                          .flexible.
                          super__Vector_base<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task,_std::allocator<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_238.
                                super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>
                                .
                                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>
                                .stack.flexible.
                                super__Vector_base<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task,_std::allocator<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_238.
                                super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>
                                .
                                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>
                                .stack.flexible.
                                super__Vector_base<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task,_std::allocator<wasm::Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::Task>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_238.super_Pass._vptr_Pass = (_func_int **)&PTR__Pass_00d87048;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238.super_Pass.name._M_dataplus._M_p != paVar1) {
          operator_delete(local_238.super_Pass.name._M_dataplus._M_p,
                          CONCAT71(local_238.super_Pass.name.field_2._M_allocated_capacity._1_7_,
                                   local_238.super_Pass.name.field_2._M_local_buf[0]) + 1);
        }
        std::
        _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
        ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                     *)&analyzer);
      }
      if (analyzer.map._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        operator_delete((void *)analyzer.map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (long)flatTable.names.
                              super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        analyzer.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
    }
  }
  return;
}

Assistant:

void optimizeExceptions(Module* module) {
    // First, check if this code even uses invokes.
    bool hasInvokes = false;
    for (auto& imp : module->functions) {
      if (isInvoke(imp.get())) {
        hasInvokes = true;
      }
    }
    if (!hasInvokes || module->tables.empty()) {
      return;
    }
    // Next, see if the Table is flat, which we need in order to see where
    // invokes go statically. (In dynamic linking, the table is not flat,
    // and we can't do this.)
    TableUtils::FlatTable flatTable(*module, *module->tables[0]);
    if (!flatTable.valid) {
      return;
    }
    // This code has exceptions. Find functions that definitely cannot throw,
    // and remove invokes to them.
    struct Info
      : public ModuleUtils::CallGraphPropertyAnalysis<Info>::FunctionInfo {
      bool canThrow = false;
    };
    ModuleUtils::CallGraphPropertyAnalysis<Info> analyzer(
      *module, [&](Function* func, Info& info) {
        if (func->imported()) {
          // Assume any import can throw. We may want to reduce this to just
          // longjmp/cxa_throw/etc.
          info.canThrow = true;
        }
      });

    // Assume a non-direct call might throw.
    analyzer.propagateBack(
      [](const Info& info) { return info.canThrow; },
      [](const Info& info) { return true; },
      [](Info& info, Function* reason) { info.canThrow = true; },
      analyzer.NonDirectCallsHaveProperty);

    // Apply the information.
    struct OptimizeInvokes : public WalkerPass<PostWalker<OptimizeInvokes>> {
      bool isFunctionParallel() override { return true; }

      std::unique_ptr<Pass> create() override {
        return std::make_unique<OptimizeInvokes>(map, flatTable);
      }

      std::map<Function*, Info>& map;
      TableUtils::FlatTable& flatTable;

      OptimizeInvokes(std::map<Function*, Info>& map,
                      TableUtils::FlatTable& flatTable)
        : map(map), flatTable(flatTable) {}

      void visitCall(Call* curr) {
        auto* target = getModule()->getFunction(curr->target);
        if (!isInvoke(target)) {
          return;
        }
        // The first operand is the function pointer index, which must be
        // constant if we are to optimize it statically.
        if (auto* index = curr->operands[0]->dynCast<Const>()) {
          size_t indexValue = index->value.geti32();
          if (indexValue >= flatTable.names.size()) {
            // UB can lead to indirect calls to invalid pointers.
            return;
          }
          auto actualTarget = flatTable.names[indexValue];
          if (actualTarget.isNull()) {
            // UB can lead to an indirect call of 0 or an index in which there
            // is no function name.
            return;
          }
          if (map[getModule()->getFunction(actualTarget)].canThrow) {
            return;
          }
          // This invoke cannot throw! Make it a direct call.
          curr->target = actualTarget;
          for (Index i = 0; i < curr->operands.size() - 1; i++) {
            curr->operands[i] = curr->operands[i + 1];
          }
          curr->operands.resize(curr->operands.size() - 1);
        }
      }
    };
    OptimizeInvokes(analyzer.map, flatTable).run(getPassRunner(), module);
  }